

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p2sc_file.c
# Opt level: O3

char * p2sc_test_file_input(char *dir,char *file)

{
  int iVar1;
  char *fmt;
  
  iVar1 = g_file_test(dir,4);
  if (iVar1 == 0) {
    fmt = "Input directory %s does not exist or is not a directory";
    iVar1 = 0x10a;
  }
  else {
    iVar1 = access(dir,4);
    if (iVar1 == 0) {
      dir = (char *)g_build_filename(dir,file,0);
      iVar1 = access(dir,4);
      if (iVar1 == 0) {
        return dir;
      }
      fmt = "Input file %s does not exist or is not readable";
      iVar1 = 0x10d;
    }
    else {
      fmt = "Input directory %s is not readable";
      iVar1 = 0x105;
    }
  }
  _p2sc_msg("p2sc_test_file_input",
            "/workspace/llm4binary/github/license_all_cmakelists_25/Helioviewer-Project[P]fits2img/libsidc/libp2sc/p2sc_file.c"
            ,iVar1,"$Id: p2sc_file.c 5108 2014-06-19 12:29:23Z bogdan $",0x1068,fmt,dir);
  exit(1);
}

Assistant:

char *p2sc_test_file_input(const char *dir, const char *file) {
    char *name = NULL;

    if (g_file_test(dir, G_FILE_TEST_IS_DIR)) {
        if (access(dir, R_OK))
            P2SC_Msg(LVL_FATAL_FILESYSTEM, "Input directory %s is not readable", dir);
        else
            name = g_build_filename(dir, file, NULL);
    } else
        P2SC_Msg(LVL_FATAL_FILESYSTEM,
                 "Input directory %s does not exist or is not a directory", dir);

    if (access(name, R_OK))
        P2SC_Msg(LVL_FATAL_FILESYSTEM, "Input file %s does not exist or is not readable", name);

    return name;
}